

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugi.cpp
# Opt level: O0

xml_node NULLCPugiXML::xml_document__root(xml_document *document)

{
  xml_document *local_20;
  xml_document *doc;
  xml_document *document_local;
  xml_node ret;
  
  if (document->impl == (xml_document_impl *)0x0) {
    nullcThrowError("xml_document constructor wasn\'t called");
    memset(&document_local,0,8);
    xml_node::xml_node((xml_node *)&document_local);
  }
  else {
    local_20 = document->impl->document;
    if (local_20 == (xml_document *)0x0) {
      local_20 = (xml_document *)nullcAllocate(0xd0);
      document->impl->document = local_20;
      pugi::xml_document::xml_document(local_20);
    }
    xml_node::xml_node((xml_node *)&document_local);
    document_local = (xml_document *)pugi::xml_node::root(&local_20->super_xml_node);
  }
  return (xml_node)(xml_node)document_local;
}

Assistant:

xml_node	xml_document__root(xml_document* document)
	{
		if(!document->impl){ nullcThrowError("xml_document constructor wasn't called"); return xml_node(); }
		pugi::xml_document *doc = document->impl->document;
		if(!doc)
		{
			doc = document->impl->document = (pugi::xml_document*)nullcAllocate(sizeof(pugi::xml_document));
			::new(doc) pugi::xml_document();
		}
		xml_node ret;
		ret.node = doc->root();
		return ret;
	}